

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SignaturePruning.cpp
# Opt level: O0

bool __thiscall
wasm::anon_unknown_147::SignaturePruning::iteration(SignaturePruning *this,Module *module)

{
  __node_base_ptr *this_00;
  __node_base_ptr *this_01;
  Type TVar1;
  undefined8 uVar2;
  bool bVar3;
  vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
  *this_02;
  mapped_type_conflict *this_03;
  reference ppCVar4;
  Expression **ppEVar5;
  reference ppCVar6;
  reference puVar7;
  vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> *this_04;
  reference pHVar8;
  vector<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
  *this_05;
  reference this_06;
  pointer pTVar9;
  reference __in;
  type *this_07;
  mapped_type *pmVar10;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *this_08;
  size_t sVar11;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *this_09;
  HeapType *this_10;
  reference puVar12;
  size_type sVar13;
  reference ppCVar14;
  reference ppCVar15;
  Type *__x;
  mapped_type *pmVar16;
  reference ppFVar17;
  reference ppEVar18;
  Call *pCVar19;
  Function *pFVar20;
  CallRef *pCVar21;
  PassRunner *pPVar22;
  Signature SVar23;
  optional<wasm::HeapType> oVar24;
  pair<std::__detail::_Node_iterator<wasm::Expression_*,_true,_false>,_bool> pVar25;
  CallRef *c_1;
  Call *c;
  HeapType type_2;
  Expression *call_1;
  iterator __end2_4;
  iterator __begin2_4;
  unordered_set<wasm::Expression_*,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<wasm::Expression_*>_>
  *__range2_4;
  unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
  callTargetTypes;
  Function *func_1;
  iterator __end3_4;
  iterator __begin3_4;
  type *__range3_4;
  Type local_4a8;
  Signature local_4a0;
  uint local_48c;
  undefined1 local_488 [4];
  Index i_2;
  vector<wasm::Type,_std::allocator<wasm::Type>_> newParams;
  value_type local_460;
  _Node_iterator_base<wasm::Expression_*,_false> local_458;
  undefined1 local_450;
  value_type local_448;
  type *local_440;
  type *outcome;
  type *removedIndexes;
  pair<wasm::SortedVector,_wasm::ParamUtils::RemovalOutcome> local_418;
  Type local_3f8;
  Type oldParams;
  undefined1 local_3e8 [4];
  Index i_1;
  SortedVector unusedParams;
  iterator iStack_3c8;
  uint i;
  iterator __end3_3;
  iterator __begin3_3;
  SortedVector *__range3_3;
  SortedVector optimizedIndexes;
  optional<wasm::HeapType> super;
  size_t numParams;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *usedParams;
  mapped_type *info_1;
  Signature sig;
  type *funcs;
  type *type_1;
  _Self local_340;
  iterator __end2_3;
  iterator __begin2_3;
  InsertOrderedMap<wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>
  *__range2_3;
  unordered_map<wasm::HeapType,_wasm::Signature,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::Signature>_>_>
  newSignatures;
  SubTypes subTypes;
  unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_> *tag;
  iterator __end2_2;
  iterator __begin2_2;
  vector<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
  *__range2_2;
  HeapType type;
  iterator __end2_1;
  iterator __begin2_1;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *__range2_1;
  uint local_234;
  _Node_iterator_base<unsigned_int,_false> _Stack_230;
  uint index;
  iterator __end3_2;
  iterator __begin3_2;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *__range3_2;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *allUsedParams;
  BasicType local_204;
  Type local_200;
  Type calledType;
  CallRef *callRef;
  iterator __end3_1;
  iterator __begin3_1;
  vector<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_> *__range3_1;
  BasicType local_1cc;
  Expression *local_1c8;
  Expression *target;
  size_t local_1b8;
  char *pcStack_1b0;
  Call *local_1a0;
  Call *call;
  iterator __end3;
  iterator __begin3;
  vector<wasm::Call_*,_std::allocator<wasm::Call_*>_> *__range3;
  mapped_type_conflict *info;
  Function *func;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *f;
  iterator __end2;
  iterator __begin2;
  vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
  *__range2;
  unordered_set<wasm::Expression_*,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<wasm::Expression_*>_>
  callTargetsToLocalize;
  InsertOrderedMap<wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>
  sigFuncs;
  unordered_map<wasm::HeapType,_Info,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_Info>_>_>
  allInfo;
  anon_class_8_1_616f97aa local_80;
  Func local_78;
  undefined1 local_58 [8];
  ParallelFunctionAnalysis<Info,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap> analysis;
  Module *module_local;
  SignaturePruning *this_local;
  
  local_80.module = (Module **)&analysis.field_0x30;
  analysis._48_8_ = module;
  std::
  function<void(wasm::Function*,wasm::(anonymous_namespace)::SignaturePruning::iteration(wasm::Module*)::Info&)>
  ::
  function<wasm::(anonymous_namespace)::SignaturePruning::iteration(wasm::Module*)::_lambda(wasm::Function*,wasm::(anonymous_namespace)::SignaturePruning::iteration(wasm::Module*)::Info&)_1_,void>
            ((function<void(wasm::Function*,wasm::(anonymous_namespace)::SignaturePruning::iteration(wasm::Module*)::Info&)>
              *)&local_78,&local_80);
  wasm::ModuleUtils::
  ParallelFunctionAnalysis<Info,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>::
  ParallelFunctionAnalysis
            ((ParallelFunctionAnalysis<Info,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap> *)
             local_58,module,&local_78);
  std::function<void_(wasm::Function_*,_Info_&)>::~function
            ((function<void_(wasm::Function_*,_Info_&)> *)&local_78);
  std::
  unordered_map<wasm::HeapType,_Info,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_Info>_>_>
  ::unordered_map((unordered_map<wasm::HeapType,_Info,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_Info>_>_>
                   *)&sigFuncs.List.
                      super__List_base<std::pair<const_wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>_>
                      ._M_impl._M_node._M_size);
  InsertOrderedMap<wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>
  ::InsertOrderedMap((InsertOrderedMap<wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>
                      *)&callTargetsToLocalize._M_h._M_single_bucket);
  std::
  unordered_set<wasm::Expression_*,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<wasm::Expression_*>_>
  ::unordered_set((unordered_set<wasm::Expression_*,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<wasm::Expression_*>_>
                   *)&__range2);
  this_02 = (vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
             *)(analysis._48_8_ + 0x18);
  __end2 = std::
           vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ::begin(this_02);
  f = (unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
      std::
      vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
      ::end(this_02);
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
                                     *)&f), bVar3) {
    func = (Function *)
           __gnu_cxx::
           __normal_iterator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
           ::operator*(&__end2);
    info = (mapped_type_conflict *)
           std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::get
                     ((unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)func);
    this_03 = std::
              map<wasm::Function_*,_Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_Info>_>_>
              ::operator[]((map<wasm::Function_*,_Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_Info>_>_>
                            *)&analysis,(key_type *)&info);
    __end3 = std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>::begin(&this_03->calls);
    call = (Call *)std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>::end(&this_03->calls);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<wasm::Call_**,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>
                                       *)&call), bVar3) {
      ppCVar4 = __gnu_cxx::
                __normal_iterator<wasm::Call_**,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>
                ::operator*(&__end3);
      local_1a0 = *ppCVar4;
      local_1b8 = (local_1a0->target).super_IString.str._M_len;
      pcStack_1b0 = (local_1a0->target).super_IString.str._M_str;
      pFVar20 = Module::getFunction((Module *)analysis._48_8_,
                                    (Name)(local_1a0->target).super_IString.str);
      pmVar10 = std::
                unordered_map<wasm::HeapType,_Info,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_Info>_>_>
                ::operator[]((unordered_map<wasm::HeapType,_Info,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_Info>_>_>
                              *)&sigFuncs.List.
                                 super__List_base<std::pair<const_wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>_>
                                 ._M_impl._M_node._M_size,&pFVar20->type);
      std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>::push_back
                (&pmVar10->calls,&local_1a0);
      Intrinsics::Intrinsics((Intrinsics *)&target,(Module *)analysis._48_8_);
      pCVar19 = Intrinsics::isCallWithoutEffects((Intrinsics *)&target,(Expression *)local_1a0);
      if (pCVar19 != (Call *)0x0) {
        ppEVar5 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::back
                            (&(local_1a0->operands).
                              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                            );
        local_1c8 = *ppEVar5;
        local_1cc = unreachable;
        bVar3 = wasm::Type::operator!=(&local_1c8->type,&local_1cc);
        if (bVar3) {
          __range3_1 = (vector<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_> *)
                       wasm::Type::getHeapType(&local_1c8->type);
          pmVar10 = std::
                    unordered_map<wasm::HeapType,_Info,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_Info>_>_>
                    ::operator[]((unordered_map<wasm::HeapType,_Info,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_Info>_>_>
                                  *)&sigFuncs.List.
                                     super__List_base<std::pair<const_wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>_>
                                     ._M_impl._M_node._M_size,(key_type *)&__range3_1);
          pmVar10->optimizable = false;
        }
      }
      __gnu_cxx::
      __normal_iterator<wasm::Call_**,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>::
      operator++(&__end3);
    }
    __end3_1 = std::vector<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>::begin
                         (&this_03->callRefs);
    callRef = (CallRef *)
              std::vector<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>::end
                        (&this_03->callRefs);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end3_1,
                              (__normal_iterator<wasm::CallRef_**,_std::vector<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>_>
                               *)&callRef), bVar3) {
      ppCVar6 = __gnu_cxx::
                __normal_iterator<wasm::CallRef_**,_std::vector<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>_>
                ::operator*(&__end3_1);
      calledType.id = (uintptr_t)*ppCVar6;
      local_200.id = (((CallRef *)calledType.id)->target->type).id;
      local_204 = unreachable;
      bVar3 = wasm::Type::operator!=(&local_200,&local_204);
      if (bVar3) {
        allUsedParams =
             (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
              *)wasm::Type::getHeapType(&local_200);
        pmVar10 = std::
                  unordered_map<wasm::HeapType,_Info,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_Info>_>_>
                  ::operator[]((unordered_map<wasm::HeapType,_Info,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_Info>_>_>
                                *)&sigFuncs.List.
                                   super__List_base<std::pair<const_wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>_>
                                   ._M_impl._M_node._M_size,(key_type *)&allUsedParams);
        std::vector<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>::push_back
                  (&pmVar10->callRefs,(value_type *)&calledType);
      }
      __gnu_cxx::
      __normal_iterator<wasm::CallRef_**,_std::vector<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>_>
      ::operator++(&__end3_1);
    }
    pmVar10 = std::
              unordered_map<wasm::HeapType,_Info,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_Info>_>_>
              ::operator[]((unordered_map<wasm::HeapType,_Info,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_Info>_>_>
                            *)&sigFuncs.List.
                               super__List_base<std::pair<const_wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>_>
                               ._M_impl._M_node._M_size,
                           (key_type *)&(info->usedParams)._M_h._M_bucket_count);
    __end3_2 = std::
               unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
               ::begin(&this_03->usedParams);
    _Stack_230._M_cur =
         (__node_type *)
         std::
         unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
         ::end(&this_03->usedParams);
    while (bVar3 = std::__detail::operator!=
                             (&__end3_2.super__Node_iterator_base<unsigned_int,_false>,
                              &stack0xfffffffffffffdd0), bVar3) {
      puVar7 = std::__detail::_Node_iterator<unsigned_int,_true,_false>::operator*(&__end3_2);
      local_234 = *puVar7;
      std::
      unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
      ::insert(&pmVar10->usedParams,&local_234);
      std::__detail::_Node_iterator<unsigned_int,_true,_false>::operator++(&__end3_2);
    }
    if ((this_03->optimizable & 1U) == 0) {
      pmVar10 = std::
                unordered_map<wasm::HeapType,_Info,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_Info>_>_>
                ::operator[]((unordered_map<wasm::HeapType,_Info,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_Info>_>_>
                              *)&sigFuncs.List.
                                 super__List_base<std::pair<const_wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>_>
                                 ._M_impl._M_node._M_size,
                             (key_type *)&(info->usedParams)._M_h._M_bucket_count);
      pmVar10->optimizable = false;
    }
    this_04 = InsertOrderedMap<wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>
              ::operator[]((InsertOrderedMap<wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>
                            *)&callTargetsToLocalize._M_h._M_single_bucket,
                           (HeapType *)&(info->usedParams)._M_h._M_bucket_count);
    std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>::push_back
              (this_04,(value_type *)&info);
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
    ::operator++(&__end2);
  }
  wasm::ModuleUtils::getPublicHeapTypes
            ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&__begin2_1,
             (Module *)analysis._48_8_);
  __end2_1 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::begin
                       ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&__begin2_1);
  type.id = (uintptr_t)
            std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::end
                      ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&__begin2_1);
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end2_1,
                            (__normal_iterator<wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
                             *)&type), bVar3) {
    pHVar8 = __gnu_cxx::
             __normal_iterator<wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
             ::operator*(&__end2_1);
    __range2_2 = (vector<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                  *)pHVar8->id;
    bVar3 = HeapType::isFunction((HeapType *)&__range2_2);
    if (bVar3) {
      pmVar10 = std::
                unordered_map<wasm::HeapType,_Info,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_Info>_>_>
                ::operator[]((unordered_map<wasm::HeapType,_Info,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_Info>_>_>
                              *)&sigFuncs.List.
                                 super__List_base<std::pair<const_wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>_>
                                 ._M_impl._M_node._M_size,(key_type *)&__range2_2);
      pmVar10->optimizable = false;
    }
    __gnu_cxx::
    __normal_iterator<wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
    ::operator++(&__end2_1);
  }
  std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~vector
            ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&__begin2_1);
  this_05 = (vector<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
             *)(analysis._48_8_ + 0x48);
  __end2_2 = std::
             vector<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
             ::begin(this_05);
  tag = (unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_> *)
        std::
        vector<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
        ::end(this_05);
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end2_2,
                            (__normal_iterator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_*,_std::vector<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>_>
                             *)&tag), bVar3) {
    this_06 = __gnu_cxx::
              __normal_iterator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_*,_std::vector<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>_>
              ::operator*(&__end2_2);
    pTVar9 = std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>::operator->(this_06);
    pmVar10 = std::
              unordered_map<wasm::HeapType,_Info,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_Info>_>_>
              ::operator[]((unordered_map<wasm::HeapType,_Info,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_Info>_>_>
                            *)&sigFuncs.List.
                               super__List_base<std::pair<const_wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>_>
                               ._M_impl._M_node._M_size,&pTVar9->type);
    pmVar10->optimizable = false;
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_*,_std::vector<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>_>
    ::operator++(&__end2_2);
  }
  SubTypes::SubTypes((SubTypes *)&newSignatures._M_h._M_single_bucket,(Module *)analysis._48_8_);
  std::
  unordered_map<wasm::HeapType,_wasm::Signature,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::Signature>_>_>
  ::unordered_map((unordered_map<wasm::HeapType,_wasm::Signature,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::Signature>_>_>
                   *)&__range2_3);
  this_00 = &callTargetsToLocalize._M_h._M_single_bucket;
  __end2_3 = InsertOrderedMap<wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>
             ::begin((InsertOrderedMap<wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>
                      *)this_00);
  local_340._M_node =
       (_List_node_base *)
       InsertOrderedMap<wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>
       ::end((InsertOrderedMap<wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>
              *)this_00);
  do {
    bVar3 = std::operator!=(&__end2_3,&local_340);
    uVar2 = analysis._48_8_;
    if (!bVar3) {
      callTargetTypes._M_h._M_single_bucket = (__node_base_ptr)0x0;
      this_01 = &callTargetTypes._M_h._M_single_bucket;
      std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector
                ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)this_01);
      GlobalTypeRewriter::updateSignatures
                ((SignatureUpdates *)&__range2_3,(Module *)uVar2,
                 (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)this_01);
      std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~vector
                ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                 &callTargetTypes._M_h._M_single_bucket);
      bVar3 = std::
              unordered_set<wasm::Expression_*,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<wasm::Expression_*>_>
              ::empty((unordered_set<wasm::Expression_*,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<wasm::Expression_*>_>
                       *)&__range2);
      if (bVar3) {
        this_local._7_1_ = false;
        unusedParams.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
      }
      else {
        std::
        unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
        ::unordered_set((unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
                         *)&__range2_4);
        __end2_4 = std::
                   unordered_set<wasm::Expression_*,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<wasm::Expression_*>_>
                   ::begin((unordered_set<wasm::Expression_*,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<wasm::Expression_*>_>
                            *)&__range2);
        call_1 = (Expression *)
                 std::
                 unordered_set<wasm::Expression_*,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<wasm::Expression_*>_>
                 ::end((unordered_set<wasm::Expression_*,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<wasm::Expression_*>_>
                        *)&__range2);
        while (bVar3 = std::__detail::operator!=
                                 (&__end2_4.super__Node_iterator_base<wasm::Expression_*,_false>,
                                  (_Node_iterator_base<wasm::Expression_*,_false> *)&call_1),
              uVar2 = analysis._48_8_, bVar3) {
          ppEVar18 = std::__detail::_Node_iterator<wasm::Expression_*,_true,_false>::operator*
                               (&__end2_4);
          type_2.id = (uintptr_t)*ppEVar18;
          HeapType::HeapType((HeapType *)&c);
          pCVar19 = Expression::dynCast<wasm::Call>((Expression *)type_2.id);
          if (pCVar19 == (Call *)0x0) {
            pCVar21 = Expression::dynCast<wasm::CallRef>((Expression *)type_2.id);
            if (pCVar21 == (CallRef *)0x0) {
              handle_unreachable("bad call",
                                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/SignaturePruning.cpp"
                                 ,0x13e);
            }
            c = (Call *)wasm::Type::getHeapType(&pCVar21->target->type);
          }
          else {
            pFVar20 = Module::getFunction((Module *)analysis._48_8_,
                                          (Name)(pCVar19->target).super_IString.str);
            c = (Call *)(pFVar20->type).id;
          }
          std::
          unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
          ::insert((unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
                    *)&__range2_4,(value_type *)&c);
          std::__detail::_Node_iterator<wasm::Expression_*,_true,_false>::operator++(&__end2_4);
        }
        pPVar22 = Pass::getPassRunner(&this->super_Pass);
        ParamUtils::localizeCallsTo
                  ((unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
                    *)&__range2_4,(Module *)uVar2,pPVar22);
        this_local._7_1_ = true;
        unusedParams.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
        std::
        unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
        ::~unordered_set((unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
                          *)&__range2_4);
      }
      std::
      unordered_map<wasm::HeapType,_wasm::Signature,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::Signature>_>_>
      ::~unordered_map((unordered_map<wasm::HeapType,_wasm::Signature,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::Signature>_>_>
                        *)&__range2_3);
      SubTypes::~SubTypes((SubTypes *)&newSignatures._M_h._M_single_bucket);
      std::
      unordered_set<wasm::Expression_*,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<wasm::Expression_*>_>
      ::~unordered_set((unordered_set<wasm::Expression_*,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<wasm::Expression_*>_>
                        *)&__range2);
      InsertOrderedMap<wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>
      ::~InsertOrderedMap((InsertOrderedMap<wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>
                           *)&callTargetsToLocalize._M_h._M_single_bucket);
      std::
      unordered_map<wasm::HeapType,_Info,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_Info>_>_>
      ::~unordered_map((unordered_map<wasm::HeapType,_Info,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_Info>_>_>
                        *)&sigFuncs.List.
                           super__List_base<std::pair<const_wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>_>
                           ._M_impl._M_node._M_size);
      wasm::ModuleUtils::
      ParallelFunctionAnalysis<Info,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>::
      ~ParallelFunctionAnalysis
                ((ParallelFunctionAnalysis<Info,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
                  *)local_58);
      return this_local._7_1_;
    }
    __in = std::
           _List_iterator<std::pair<const_wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>
           ::operator*(&__end2_3);
    this_07 = std::
              get<0ul,wasm::HeapType_const,std::vector<wasm::Function*,std::allocator<wasm::Function*>>>
                        (__in);
    sig.results.id =
         (uintptr_t)
         std::
         get<1ul,wasm::HeapType_const,std::vector<wasm::Function*,std::allocator<wasm::Function*>>>
                   (__in);
    SVar23 = HeapType::getSignature(this_07);
    sig.params = SVar23.results.id;
    info_1 = (mapped_type *)SVar23.params.id;
    pmVar10 = std::
              unordered_map<wasm::HeapType,_Info,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_Info>_>_>
              ::operator[]((unordered_map<wasm::HeapType,_Info,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_Info>_>_>
                            *)&sigFuncs.List.
                               super__List_base<std::pair<const_wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>_>
                               ._M_impl._M_node._M_size,this_07);
    this_08 = &pmVar10->usedParams;
    sVar11 = wasm::Type::size((Type *)&info_1);
    if ((pmVar10->optimizable & 1U) != 0) {
      this_09 = SubTypes::getImmediateSubTypes
                          ((SubTypes *)&newSignatures._M_h._M_single_bucket,(HeapType)this_07->id);
      bVar3 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::empty(this_09);
      if (bVar3) {
        oVar24 = HeapType::getDeclaredSuperType(this_07);
        optimizedIndexes.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             oVar24.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::HeapType>._M_payload;
        bVar3 = std::optional::operator_cast_to_bool
                          ((optional *)
                           &optimizedIndexes.
                            super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage);
        if (bVar3) {
          this_10 = std::optional<wasm::HeapType>::operator->
                              ((optional<wasm::HeapType> *)
                               &optimizedIndexes.
                                super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage);
          bVar3 = HeapType::isSignature(this_10);
          if (bVar3) goto LAB_020506bd;
        }
        ParamUtils::applyConstantValues
                  ((SortedVector *)&__range3_3,
                   (vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> *)sig.results.id,
                   &pmVar10->calls,&pmVar10->callRefs,(Module *)analysis._48_8_);
        __end3_3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range3_3);
        iStack_3c8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                               ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range3_3);
        while (bVar3 = __gnu_cxx::operator!=(&__end3_3,&stack0xfffffffffffffc38), bVar3) {
          puVar12 = __gnu_cxx::
                    __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                    ::operator*(&__end3_3);
          unusedParams.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ = *puVar12;
          std::
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          ::erase(this_08,(key_type *)
                          ((long)&unusedParams.
                                  super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage + 4));
          __gnu_cxx::
          __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
          ::operator++(&__end3_3);
        }
        sVar13 = std::
                 unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                 ::size(this_08);
        if (sVar13 == sVar11) {
          unusedParams.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._0_4_ = 0xf;
        }
        else {
          SortedVector::SortedVector((SortedVector *)local_3e8);
          for (oldParams.id._4_4_ = 0; TVar1.id = sig.results.id, oldParams.id._4_4_ < sVar11;
              oldParams.id._4_4_ = oldParams.id._4_4_ + 1) {
            sVar13 = std::
                     unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                     ::count(this_08,(key_type *)((long)&oldParams.id + 4));
            if (sVar13 == 0) {
              SortedVector::insert((SortedVector *)local_3e8,oldParams.id._4_4_);
            }
          }
          local_3f8.id = (uintptr_t)info_1;
          SortedVector::SortedVector((SortedVector *)&removedIndexes,(SortedVector *)local_3e8);
          uVar2 = analysis._48_8_;
          pPVar22 = Pass::getPassRunner(&this->super_Pass);
          ParamUtils::removeParameters
                    (&local_418,
                     (vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> *)TVar1.id,
                     (SortedVector *)&removedIndexes,&pmVar10->calls,&pmVar10->callRefs,
                     (Module *)uVar2,pPVar22);
          SortedVector::~SortedVector((SortedVector *)&removedIndexes);
          outcome = (type *)std::get<0ul,wasm::SortedVector,wasm::ParamUtils::RemovalOutcome>
                                      (&local_418);
          local_440 = std::get<1ul,wasm::SortedVector,wasm::ParamUtils::RemovalOutcome>(&local_418);
          if (*local_440 == Failure) {
            bVar3 = std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>::empty(&pmVar10->calls)
            ;
            if (bVar3) {
              bVar3 = std::vector<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>::empty
                                (&pmVar10->callRefs);
              if (((bVar3 ^ 0xffU) & 1) == 0) {
                __assert_fail("!info.callRefs.empty()",
                              "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/SignaturePruning.cpp"
                              ,0x100,
                              "bool wasm::(anonymous namespace)::SignaturePruning::iteration(Module *)"
                             );
              }
              ppCVar15 = std::vector<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>::operator[]
                                   (&pmVar10->callRefs,0);
              local_460 = *ppCVar15;
              pVar25 = std::
                       unordered_set<wasm::Expression_*,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<wasm::Expression_*>_>
                       ::insert((unordered_set<wasm::Expression_*,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<wasm::Expression_*>_>
                                 *)&__range2,(value_type *)&local_460);
              newParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage =
                   (pointer)pVar25.first.super__Node_iterator_base<wasm::Expression_*,_false>._M_cur
              ;
            }
            else {
              ppCVar14 = std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>::operator[]
                                   (&pmVar10->calls,0);
              local_448 = *ppCVar14;
              pVar25 = std::
                       unordered_set<wasm::Expression_*,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<wasm::Expression_*>_>
                       ::insert((unordered_set<wasm::Expression_*,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<wasm::Expression_*>_>
                                 *)&__range2,(value_type *)&local_448);
              local_458._M_cur =
                   (__node_type *)
                   pVar25.first.super__Node_iterator_base<wasm::Expression_*,_false>._M_cur;
              local_450 = pVar25.second;
            }
          }
          bVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)outcome);
          if (bVar3) {
            unusedParams.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._0_4_ = 0xf;
          }
          else {
            std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector
                      ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_488);
            for (local_48c = 0; local_48c < sVar11; local_48c = local_48c + 1) {
              bVar3 = SortedVector::has((SortedVector *)outcome,local_48c);
              if (!bVar3) {
                __x = wasm::Type::operator[](&local_3f8,(ulong)local_48c);
                std::vector<wasm::Type,_std::allocator<wasm::Type>_>::push_back
                          ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_488,__x);
              }
            }
            wasm::Type::Type(&local_4a8,(Tuple *)local_488);
            Signature::Signature(&local_4a0,local_4a8,sig.params);
            pmVar16 = std::
                      unordered_map<wasm::HeapType,_wasm::Signature,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::Signature>_>_>
                      ::operator[]((unordered_map<wasm::HeapType,_wasm::Signature,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::Signature>_>_>
                                    *)&__range2_3,this_07);
            TVar1 = sig.results;
            (pmVar16->params).id = local_4a0.params.id;
            (pmVar16->results).id = local_4a0.results.id;
            __end3_4 = std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>::begin
                                 ((vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> *)
                                  sig.results.id);
            func_1 = (Function *)
                     std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>::end
                               ((vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> *)
                                TVar1.id);
            while (bVar3 = __gnu_cxx::operator!=
                                     (&__end3_4,
                                      (__normal_iterator<wasm::Function_**,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>
                                       *)&func_1), bVar3) {
              ppFVar17 = __gnu_cxx::
                         __normal_iterator<wasm::Function_**,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>
                         ::operator*(&__end3_4);
              ((*ppFVar17)->type).id = this_07->id;
              __gnu_cxx::
              __normal_iterator<wasm::Function_**,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>
              ::operator++(&__end3_4);
            }
            std::vector<wasm::Type,_std::allocator<wasm::Type>_>::~vector
                      ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_488);
            unusedParams.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
          }
          std::pair<wasm::SortedVector,_wasm::ParamUtils::RemovalOutcome>::~pair(&local_418);
          SortedVector::~SortedVector((SortedVector *)local_3e8);
        }
        SortedVector::~SortedVector((SortedVector *)&__range3_3);
      }
    }
LAB_020506bd:
    std::
    _List_iterator<std::pair<const_wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>
    ::operator++(&__end2_3);
  } while( true );
}

Assistant:

bool iteration(Module* module) {
    // First, find all the information we need. Start by collecting inside each
    // function in parallel.

    struct Info {
      std::vector<Call*> calls;
      std::vector<CallRef*> callRefs;

      std::unordered_set<Index> usedParams;

      // If we set this to false, we may not attempt to perform any optimization
      // whatsoever on this data.
      bool optimizable = true;
    };

    ModuleUtils::ParallelFunctionAnalysis<Info> analysis(
      *module, [&](Function* func, Info& info) {
        if (func->imported()) {
          // Imports cannot be modified.
          info.optimizable = false;
          return;
        }

        info.calls = std::move(FindAll<Call>(func->body).list);
        info.callRefs = std::move(FindAll<CallRef>(func->body).list);
        info.usedParams = ParamUtils::getUsedParams(func, module);
      });

    // A map of types to all the information combined over all the functions
    // with that type.
    std::unordered_map<HeapType, Info> allInfo;

    // Map heap types to all functions with that type.
    InsertOrderedMap<HeapType, std::vector<Function*>> sigFuncs;

    // Heap types of call targets that we found we should localize calls to, in
    // order to fully handle them. (See similar code in DeadArgumentElimination
    // for individual functions; here we handle a HeapType at a time.) A slight
    // complication is that we cannot track heap types here: heap types are
    // rewritten using |GlobalTypeRewriter::updateSignatures| below, and even
    // types that we do not modify end up replaced (as the entire set of types
    // becomes one new big rec group). We therefore need something more stable
    // to track here, which we do using either a Call or a Call Ref.
    std::unordered_set<Expression*> callTargetsToLocalize;

    // Combine all the information we gathered into that map, iterating in a
    // deterministic order as we build up vectors where the order matters.
    for (auto& f : module->functions) {
      auto* func = f.get();
      auto& info = analysis.map[func];

      // For direct calls, add each call to the type of the function being
      // called.
      for (auto* call : info.calls) {
        allInfo[module->getFunction(call->target)->type].calls.push_back(call);

        // Intrinsics limit our ability to optimize in some cases. We will avoid
        // modifying any type that is used by call.without.effects, to avoid
        // the complexity of handling that. After intrinsics are lowered,
        // this optimization will be able to run at full power anyhow.
        if (Intrinsics(*module).isCallWithoutEffects(call)) {
          // The last operand is the actual call target.
          auto* target = call->operands.back();
          if (target->type != Type::unreachable) {
            allInfo[target->type.getHeapType()].optimizable = false;
          }
        }
      }

      // For indirect calls, add each call_ref to the type the call_ref uses.
      for (auto* callRef : info.callRefs) {
        auto calledType = callRef->target->type;
        if (calledType != Type::unreachable) {
          allInfo[calledType.getHeapType()].callRefs.push_back(callRef);
        }
      }

      // A parameter used in this function is used in the heap type - just one
      // function is enough to prevent the parameter from being removed.
      auto& allUsedParams = allInfo[func->type].usedParams;
      for (auto index : info.usedParams) {
        allUsedParams.insert(index);
      }

      if (!info.optimizable) {
        allInfo[func->type].optimizable = false;
      }

      sigFuncs[func->type].push_back(func);
    }

    // Find the public types, which cannot be modified.
    for (auto type : ModuleUtils::getPublicHeapTypes(*module)) {
      if (type.isFunction()) {
        allInfo[type].optimizable = false;
      }
    }

    // Similarly, we cannot yet modify types used in exception handling or stack
    // switching tags. TODO.
    for (auto& tag : module->tags) {
      allInfo[tag->type].optimizable = false;
    }

    // A type must have the same number of parameters and results as its
    // supertypes and subtypes, so we only attempt to modify types without
    // supertypes or subtypes.
    // TODO We could handle "cycles" where we remove fields from a group of
    //      types with subtyping relations at once.
    SubTypes subTypes(*module);

    // Maps each heap type to the possible pruned signature. We will fill this
    // during analysis and then use it while doing an update of the types. If a
    // type has no improvement that we can find, it will not appear in this map.
    std::unordered_map<HeapType, Signature> newSignatures;

    // Find parameters to prune.
    //
    // TODO: The order matters here, and more than one cycle can find more work
    //       in some cases, as finding a parameter is a constant and removing it
    //       can lead to another call (that receives that parameter's value) to
    //       now have constant parameters as well, and so it becomes
    //       optimizable. We could do a topological sort or greatest fixed point
    //       analysis to be optimal (that could handle a recursive call with a
    //       constant).
    for (auto& [type, funcs] : sigFuncs) {
      auto sig = type.getSignature();
      auto& info = allInfo[type];
      auto& usedParams = info.usedParams;
      auto numParams = sig.params.size();

      if (!info.optimizable) {
        continue;
      }

      if (!subTypes.getImmediateSubTypes(type).empty()) {
        continue;
      }
      if (auto super = type.getDeclaredSuperType()) {
        if (super->isSignature()) {
          continue;
        }
      }

      // Apply constant indexes: find the parameters that are always sent a
      // constant value, and apply that value in the function. That then makes
      // the parameter unused (since the applied value makes us ignore the value
      // arriving in the parameter).
      auto optimizedIndexes = ParamUtils::applyConstantValues(
        funcs, info.calls, info.callRefs, module);
      for (auto i : optimizedIndexes) {
        usedParams.erase(i);
      }

      if (usedParams.size() == numParams) {
        // All parameters are used, give up on this one.
        continue;
      }

      // We found possible work! Find the specific params that are unused & try
      // to prune them.
      SortedVector unusedParams;
      for (Index i = 0; i < numParams; i++) {
        if (usedParams.count(i) == 0) {
          unusedParams.insert(i);
        }
      }

      auto oldParams = sig.params;
      auto [removedIndexes, outcome] =
        ParamUtils::removeParameters(funcs,
                                     unusedParams,
                                     info.calls,
                                     info.callRefs,
                                     module,
                                     getPassRunner());
      if (outcome == ParamUtils::RemovalOutcome::Failure) {
        // Use either a Call or a CallRef that has this type (see explanation
        // above on |callTargetsToLocalize|.
        if (!info.calls.empty()) {
          callTargetsToLocalize.insert(info.calls[0]);
        } else {
          assert(!info.callRefs.empty());
          callTargetsToLocalize.insert(info.callRefs[0]);
        }
      }
      if (removedIndexes.empty()) {
        continue;
      }

      // Success! Update the types.
      std::vector<Type> newParams;
      for (Index i = 0; i < numParams; i++) {
        if (!removedIndexes.has(i)) {
          newParams.push_back(oldParams[i]);
        }
      }

      // Create a new signature. When the TypeRewriter operates below it will
      // modify the existing heap type in place to change its signature to this
      // one (which preserves identity, that is, even if after pruning the new
      // signature is structurally identical to another one, it will remain
      // nominally different from those).
      newSignatures[type] = Signature(Type(newParams), sig.results);

      // removeParameters() updates the type as it goes, but in this pass we
      // need the type to match the other locations, nominally. That is, we need
      // all the functions of a particular type to still have the same type
      // after this operation, and that must be the exact same type at the
      // relevant call_refs and so forth. The TypeRewriter below will do the
      // right thing as it rewrites everything all at once, so we do not want
      // the type to be modified by removeParameters(), and so we undo the type
      // it made.
      //
      // Note that we cannot just ask removeParameters() to not update the type,
      // as it adds a new local there, whose index depends on the type (which
      // contains the # of parameters, and that determine where non-parameter
      // local indexes begin). Rather than have it update the type and then undo
      // that, which would add more complexity in that method, undo the change
      // here.
      for (auto* func : funcs) {
        func->type = type;
      }
    }

    // Rewrite the types.
    GlobalTypeRewriter::updateSignatures(newSignatures, *module);

    if (callTargetsToLocalize.empty()) {
      return false;
    }

    // Localize after updating signatures, to not interfere with that
    // operation (localization adds locals, and the indexes of locals must be
    // taken into account in |GlobalTypeRewriter::updateSignatures| (as var
    // indexes change when params are pruned).
    std::unordered_set<HeapType> callTargetTypes;
    for (auto* call : callTargetsToLocalize) {
      HeapType type;
      if (auto* c = call->dynCast<Call>()) {
        type = module->getFunction(c->target)->type;
      } else if (auto* c = call->dynCast<CallRef>()) {
        type = c->target->type.getHeapType();
      } else {
        WASM_UNREACHABLE("bad call");
      }
      callTargetTypes.insert(type);
    }

    ParamUtils::localizeCallsTo(callTargetTypes, *module, getPassRunner());

    return true;
  }